

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Dumper::appendInt(Dumper *this,int64_t v)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (v < 0) {
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x2d);
    v = -v;
  }
  if ((ulong)v < 1000000000000000000) {
    if (99999999999999999 < (ulong)v) goto LAB_00108559;
    if (9999999999999999 < (ulong)v) goto LAB_0010857a;
    if (999999999999999 < (ulong)v) goto LAB_001085a5;
    if (99999999999999 < (ulong)v) goto LAB_001085d0;
    if (0x48c27394 < (ulong)v >> 0xd) goto LAB_001085ec;
    if (0xe8d4a50 < (ulong)v >> 0xc) goto LAB_00108612;
    if (0x2e90edc < (ulong)v >> 0xb) goto LAB_00108638;
    if (0x9502f8 < (ulong)v >> 10) goto LAB_0010865e;
    if (999999999 < (ulong)v) goto LAB_00108684;
    if (99999999 < (ulong)v) goto LAB_001086a6;
    if (9999999 < (ulong)v) goto LAB_001086c8;
    if (999999 < (ulong)v) goto LAB_001086ea;
    if (99999 < (ulong)v) goto LAB_0010870c;
    if (9999 < (ulong)v) goto LAB_0010872e;
    if (999 < (ulong)v) goto LAB_00108750;
    if (99 < (ulong)v) goto LAB_00108772;
    if ((ulong)v < 10) goto LAB_001087af;
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = v;
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,(ulong)(byte)(SUB161(auVar3 / ZEXT816(1000000000000000000),0) | 0x30),
               (ulong)v % 1000000000000000000);
LAB_00108559:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = v;
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,(ulong)(byte)(SUB161(auVar4 / ZEXT816(100000000000000000),0) % 10 | 0x30)
               ,(ulong)v % 100000000000000000);
LAB_0010857a:
    auVar5._8_8_ = 0;
    auVar5._0_8_ = v;
    uVar1 = (uint)SUB162(auVar5 / ZEXT816(10000000000000000),0) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)(byte)uVar1 | 0x30,(ulong)(ushort)uVar1 | 0x30)
    ;
LAB_001085a5:
    auVar6._8_8_ = 0;
    auVar6._0_8_ = v;
    uVar1 = (uint)SUB162(auVar6 / ZEXT816(1000000000000000),0) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)(byte)uVar1 | 0x30,(ulong)(ushort)uVar1 | 0x30)
    ;
LAB_001085d0:
    uVar2 = ((ulong)v / 100000000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_001085ec:
    uVar2 = ((ulong)v / 10000000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108612:
    uVar2 = ((ulong)v / 1000000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108638:
    uVar2 = ((ulong)v / 100000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_0010865e:
    uVar2 = ((ulong)v / 10000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108684:
    uVar2 = ((ulong)v / 1000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_001086a6:
    uVar2 = ((ulong)v / 100000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_001086c8:
    uVar2 = ((ulong)v / 10000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_001086ea:
    uVar2 = ((ulong)v / 1000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_0010870c:
    uVar2 = ((ulong)v / 100000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_0010872e:
    uVar2 = ((ulong)v / 10000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108750:
    uVar2 = ((ulong)v / 1000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108772:
    uVar2 = ((ulong)v / 100) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
  }
  uVar2 = ((ulong)v / 10) % 10;
  (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_001087af:
  (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)v % 10 | 0x30,(ulong)v % 10 | 0x30);
  return;
}

Assistant:

void Dumper::appendInt(int64_t v) {
  if (v == INT64_MIN) {
    _sink->append("-9223372036854775808", 20);
    return;
  }
  if (v < 0) {
    _sink->push_back('-');
    v = -v;
  }

  if (1000000000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000000000LL) % 10);
  }
  if (100000000000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000000000LL) % 10);
  }
  if (10000000000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000000000LL) % 10);
  }
  if (1000000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000000LL) % 10);
  }
  if (100000000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000000LL) % 10);
  }
  if (10000000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000000LL) % 10);
  }
  if (1000000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000000LL) % 10);
  }
  if (100000000000LL <= v) {
    _sink->push_back('0' + (v / 100000000000LL) % 10);
  }
  if (10000000000LL <= v) {
    _sink->push_back('0' + (v / 10000000000LL) % 10);
  }
  if (1000000000LL <= v) {
    _sink->push_back('0' + (v / 1000000000LL) % 10);
  }
  if (100000000LL <= v) {
    _sink->push_back('0' + (v / 100000000LL) % 10);
  }
  if (10000000LL <= v) {
    _sink->push_back('0' + (v / 10000000LL) % 10);
  }
  if (1000000LL <= v) {
    _sink->push_back('0' + (v / 1000000LL) % 10);
  }
  if (100000LL <= v) {
    _sink->push_back('0' + (v / 100000LL) % 10);
  }
  if (10000LL <= v) {
    _sink->push_back('0' + (v / 10000LL) % 10);
  }
  if (1000LL <= v) {
    _sink->push_back('0' + (v / 1000LL) % 10);
  }
  if (100LL <= v) {
    _sink->push_back('0' + (v / 100LL) % 10);
  }
  if (10LL <= v) {
    _sink->push_back('0' + (v / 10LL) % 10);
  }

  _sink->push_back('0' + (v % 10));
}